

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Vec_Wrd_t * Gia_ManSimRelDeriveFuncs2(Gia_Man_t *p,Vec_Wrd_t *vRel,int nOuts)

{
  int nWords;
  uint uVar1;
  uint uVar2;
  Vec_Wrd_t *p_00;
  word *pwVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int i;
  char *p_01;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  int nDCs [32];
  
  nDCs[0x1c] = 0;
  nDCs[0x1d] = 0;
  nDCs[0x1e] = 0;
  nDCs[0x1f] = 0;
  nDCs[0x18] = 0;
  nDCs[0x19] = 0;
  nDCs[0x1a] = 0;
  nDCs[0x1b] = 0;
  nDCs[0x14] = 0;
  nDCs[0x15] = 0;
  nDCs[0x16] = 0;
  nDCs[0x17] = 0;
  nDCs[0x10] = 0;
  nDCs[0x11] = 0;
  nDCs[0x12] = 0;
  nDCs[0x13] = 0;
  nDCs[0xc] = 0;
  nDCs[0xd] = 0;
  nDCs[0xe] = 0;
  nDCs[0xf] = 0;
  nDCs[8] = 0;
  nDCs[9] = 0;
  nDCs[10] = 0;
  nDCs[0xb] = 0;
  nDCs[4] = 0;
  nDCs[5] = 0;
  nDCs[6] = 0;
  nDCs[7] = 0;
  nDCs[0] = 0;
  nDCs[1] = 0;
  nDCs[2] = 0;
  nDCs[3] = 0;
  uVar13 = 1 << ((byte)nOuts & 0x1f);
  nWords = vRel->nSize / (int)uVar13;
  p_00 = Vec_WrdStart(nOuts * nWords * 2);
  if ((vRel->nSize & uVar13 - 1) != 0) {
    __assert_fail("Vec_WrdSize(vRel) % nMints == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x332,"Vec_Wrd_t *Gia_ManSimRelDeriveFuncs2(Gia_Man_t *, Vec_Wrd_t *, int)");
  }
  if (nOuts < 0x21) {
    uVar4 = nWords << 6;
    uVar8 = 0;
    uVar2 = 0;
    if (0 < (int)uVar13) {
      uVar2 = uVar13;
    }
    uVar9 = 0;
    if (0 < nOuts) {
      uVar9 = (ulong)(uint)nOuts;
    }
    uVar1 = 0;
    if (0 < nWords << 6) {
      uVar1 = uVar4;
    }
    for (uVar7 = 0; uVar7 != uVar1; uVar7 = uVar7 + 1) {
      iVar14 = uVar7 << ((byte)nOuts & 0x1f);
      uVar10 = 0;
      while ((uVar11 = uVar2, uVar2 != uVar10 &&
             (uVar5 = iVar14 + uVar10, uVar11 = uVar10,
             (vRel->pArray[(int)uVar5 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) == 0))) {
        uVar10 = uVar10 + 1;
      }
      iVar6 = 0;
      for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
        uVar10 = (uVar11 ^ 1 << ((uint)uVar12 & 0x1f)) + iVar14;
        if ((vRel->pArray[(int)uVar10 >> 6] >> ((ulong)uVar10 & 0x3f) & 1) == 0) {
          i = iVar6;
          if ((1 << ((byte)uVar12 & 0x1f) & uVar11) != 0) {
            i = nWords + iVar6;
          }
          pwVar3 = Vec_WrdEntryP(p_00,i);
          pwVar3[uVar7 >> 6] = pwVar3[uVar7 >> 6] | 1L << ((byte)uVar7 & 0x3f);
        }
        else {
          nDCs[uVar12] = nDCs[uVar12] + 1;
        }
        iVar6 = iVar6 + nWords * 2;
      }
      uVar8 = (ulong)((int)uVar8 + (uint)(uVar11 == uVar13));
    }
    if ((int)uVar8 == 0) {
      iVar14 = 0;
      printf("The relation was successfully determized with don\'t-cares for %d patterns.\n",
             (ulong)uVar4);
      for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        pwVar3 = Vec_WrdEntryP(p_00,iVar14);
        uVar13 = Abc_TtCountOnesVec(pwVar3,nWords);
        pwVar3 = Vec_WrdEntryP(p_00,nWords + iVar14);
        uVar2 = Abc_TtCountOnesVec(pwVar3,nWords);
        printf("%4d : Off = %6d  On = %6d  Dc = %6d (%6.2f %%)\n",
               ((double)nDCs[uVar8] * 100.0) / (double)(int)uVar4,uVar8 & 0xffffffff,(ulong)uVar13,
               (ulong)uVar2);
        iVar14 = iVar14 + nWords * 2;
      }
      p_01 = (char *)0xa;
      putchar(10);
    }
    else {
      p_01 = "The relation is not well-defined for %d (out of %d) patterns.\n";
      printf("The relation is not well-defined for %d (out of %d) patterns.\n",uVar8,(ulong)uVar4);
    }
    Gia_ManSimRelCheckFuncs((Gia_Man_t *)p_01,vRel,nOuts,p_00);
    return p_00;
  }
  __assert_fail("nOuts <= 32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x333,"Vec_Wrd_t *Gia_ManSimRelDeriveFuncs2(Gia_Man_t *, Vec_Wrd_t *, int)");
}

Assistant:

Vec_Wrd_t * Gia_ManSimRelDeriveFuncs2( Gia_Man_t * p, Vec_Wrd_t * vRel, int nOuts )
{
    int i, k, m, nDCs[32] = {0}, Count = 0, nMints = 1 << nOuts, nWords = Vec_WrdSize(vRel) / nMints;
    Vec_Wrd_t * vFuncs = Vec_WrdStart( 2 * nOuts * nWords );
    assert( Vec_WrdSize(vRel) % nMints == 0 );
    assert( nOuts <= 32 );
    for ( i = 0; i < 64 * nWords; i++ )
    {
        for ( m = 0; m < nMints; m++ )
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) )
                break;
        Count += m == nMints;
        for ( k = 0; k < nOuts; k++ )
        {
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+(m^(1<<k)) ) )
            {
                nDCs[k]++;
                continue;
            }
            if ( (m >> k) & 1 )
                Abc_TtSetBit( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), i );
            else
                Abc_TtSetBit( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), i );
        }
        if ( 0 )
        {
            for ( m = 0; m < nMints; m++ )
                printf( "%d", Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) );
            printf( " " );
            for ( k = 0; k < nOuts; k++ )
            {
                if ( Abc_TtGetBit( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), i ) )
                    printf( "0" );
                else if ( Abc_TtGetBit( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), i ) )
                    printf( "1" );
                else
                    printf( "-" );
            }
            printf( "\n" );
        }
    }
    if ( Count )
        printf( "The relation is not well-defined for %d (out of %d) patterns.\n", Count, 64 * nWords );
    else
    {
        printf( "The relation was successfully determized with don't-cares for %d patterns.\n", 64 * nWords );
        for ( k = 0; k < nOuts; k++ )
        {
            int nOffs = Abc_TtCountOnesVec( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), nWords );
            int nOns  = Abc_TtCountOnesVec( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), nWords );
            printf( "%4d : Off = %6d  On = %6d  Dc = %6d (%6.2f %%)\n", k, nOffs, nOns, nDCs[k], 100.0*nDCs[k]/(64*nWords) );
        }
        printf( "\n" );
    }
    Gia_ManSimRelCheckFuncs( p, vRel, nOuts, vFuncs );
    return vFuncs;
}